

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void neighbors(uint16 *x,int n,int *plow,int *phigh)

{
  int i;
  int high;
  int low;
  int *phigh_local;
  int *plow_local;
  int n_local;
  uint16 *x_local;
  
  low = -1;
  high = 0x10000;
  for (i = 0; i < n; i = i + 1) {
    if ((low < (int)(uint)x[i]) && (x[i] < x[n])) {
      *plow = i;
      low = (int)x[i];
    }
    if (((uint)x[i] < (uint)high) && (x[n] < x[i])) {
      *phigh = i;
      high = (int)x[i];
    }
  }
  return;
}

Assistant:

static void neighbors(uint16 *x, int n, int *plow, int *phigh)
{
   int low = -1;
   int high = 65536;
   int i;
   for (i=0; i < n; ++i) {
      if (x[i] > low  && x[i] < x[n]) { *plow  = i; low = x[i]; }
      if (x[i] < high && x[i] > x[n]) { *phigh = i; high = x[i]; }
   }
}